

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_data_source_get_cursor_in_seconds(ma_data_source *pDataSource,float *pCursor)

{
  uint local_34;
  ma_uint64 mStack_30;
  ma_uint32 sampleRate;
  ma_uint64 cursorInPCMFrames;
  float *pfStack_20;
  ma_result result;
  float *pCursor_local;
  ma_data_source *pDataSource_local;
  
  if (pCursor == (float *)0x0) {
    pDataSource_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    *pCursor = 0.0;
    pfStack_20 = pCursor;
    pCursor_local = (float *)pDataSource;
    cursorInPCMFrames._4_4_ =
         ma_data_source_get_cursor_in_pcm_frames(pDataSource,&stack0xffffffffffffffd0);
    pDataSource_local._4_4_ = cursorInPCMFrames._4_4_;
    if ((cursorInPCMFrames._4_4_ == MA_SUCCESS) &&
       (pDataSource_local._4_4_ =
             ma_data_source_get_data_format
                       (pCursor_local,(ma_format *)0x0,(ma_uint32 *)0x0,&local_34,(ma_channel *)0x0,
                        0), pDataSource_local._4_4_ == MA_SUCCESS)) {
      *pfStack_20 = (float)(long)mStack_30 / (float)local_34;
      pDataSource_local._4_4_ = MA_SUCCESS;
    }
  }
  return pDataSource_local._4_4_;
}

Assistant:

MA_API ma_result ma_data_source_get_cursor_in_seconds(ma_data_source* pDataSource, float* pCursor)
{
    ma_result result;
    ma_uint64 cursorInPCMFrames;
    ma_uint32 sampleRate;

    if (pCursor == NULL) {
        return MA_INVALID_ARGS;
    }

    *pCursor = 0;

    result = ma_data_source_get_cursor_in_pcm_frames(pDataSource, &cursorInPCMFrames);
    if (result != MA_SUCCESS) {
        return result;
    }

    result = ma_data_source_get_data_format(pDataSource, NULL, NULL, &sampleRate, NULL, 0);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* VC6 does not support division of unsigned 64-bit integers with floating point numbers. Need to use a signed number. This shouldn't effect anything in practice. */
    *pCursor = (ma_int64)cursorInPCMFrames / (float)sampleRate;

    return MA_SUCCESS;
}